

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_small_vector.cpp
# Opt level: O0

void __thiscall
SmallVector_MoveLarge_Test::~SmallVector_MoveLarge_Test(SmallVector_MoveLarge_Test *this)

{
  SmallVector_MoveLarge_Test *this_local;
  
  ~SmallVector_MoveLarge_Test(this);
  ::operator_delete(this,0x10);
  return;
}

Assistant:

TEST (SmallVector, MoveLarge) {
    // The two containers start out with different sizes; one uses the small
    // buffer, the other, large.
    pstore::small_vector<int, 3> a (std::size_t{0});
    pstore::small_vector<int, 3> b (std::size_t{4});
    std::fill (std::begin (a), std::end (a), 0);
    std::fill (std::begin (b), std::end (b), 73);
    a = std::move (b);

    EXPECT_THAT (a, ::testing::ElementsAre (73, 73, 73, 73));
}